

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O0

void __thiscall viface::VIface::VIface(VIface *this,string *name,bool tap,int id)

{
  VIfaceImpl *this_00;
  string local_40 [32];
  int local_20;
  byte local_19;
  int id_local;
  bool tap_local;
  string *name_local;
  VIface *this_local;
  
  local_20 = id;
  local_19 = tap;
  _id_local = name;
  name_local = (string *)this;
  this_00 = (VIfaceImpl *)operator_new(0x168);
  std::__cxx11::string::string(local_40,(string *)name);
  VIfaceImpl::VIfaceImpl(this_00,(string *)local_40,(bool)(local_19 & 1),local_20);
  std::unique_ptr<viface::VIfaceImpl,std::default_delete<viface::VIfaceImpl>>::
  unique_ptr<std::default_delete<viface::VIfaceImpl>,void>
            ((unique_ptr<viface::VIfaceImpl,std::default_delete<viface::VIfaceImpl>> *)this,this_00)
  ;
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

VIface::VIface(string name, bool tap, int id) :
    pimpl(new VIfaceImpl(name, tap, id))
{}